

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_wordwrap(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_4c;
  int nMax;
  int iChunk;
  int iBreaklen;
  int iLen;
  char *zBreak;
  char *zEnd;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    zEnd = jx9_value_to_string(*apArg,&iChunk);
    if (iChunk < 1) {
      jx9_result_string(pjStack_18,"",0);
    }
    else {
      local_4c = 0x4b;
      nMax = 0;
      _iBreaklen = "";
      if (1 < apArg_local._4_4_) {
        local_4c = jx9_value_to_int(*(jx9_value **)(zIn + 8));
        if (local_4c < 1) {
          local_4c = 0x4b;
        }
        if (2 < apArg_local._4_4_) {
          _iBreaklen = jx9_value_to_string(*(jx9_value **)(zIn + 0x10),&nMax);
        }
      }
      if (nMax < 1) {
        _iBreaklen = "\n";
        nMax = 1;
      }
      zBreak = zEnd + iChunk;
      while (zEnd < zBreak) {
        iVar1 = (int)zBreak - (int)zEnd;
        if (iVar1 < local_4c) {
          local_4c = iVar1;
        }
        jx9_result_string(pjStack_18,zEnd,local_4c);
        zEnd = zEnd + local_4c;
        if (zEnd < zBreak) {
          jx9_result_string(pjStack_18,_iBreaklen,nMax);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_wordwrap(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zBreak;
	int iLen, iBreaklen, iChunk;
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Nothing to process, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Chunk length */
	iChunk = 75;
	iBreaklen = 0;
	zBreak = ""; /* cc warning */
	if( nArg > 1 ){
		iChunk = jx9_value_to_int(apArg[1]);
		if( iChunk < 1 ){
			iChunk = 75;
		}
		if( nArg > 2 ){
			zBreak = jx9_value_to_string(apArg[2], &iBreaklen);
		}
	}
	if( iBreaklen < 1 ){
		/* Set a default column break */
#ifdef __WINNT__
		zBreak = "\r\n";
		iBreaklen = (int)sizeof("\r\n")-1;
#else
		zBreak = "\n";
		iBreaklen = (int)sizeof(char);
#endif
	}
	/* Perform the requested operation */
	zEnd = &zIn[iLen];
	for(;;){
		int nMax;
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		nMax = (int)(zEnd-zIn);
		if( iChunk > nMax ){
			iChunk = nMax;
		}
		/* Append the column first */
		jx9_result_string(pCtx, zIn, iChunk); /* Will make it's own copy */
		/* Advance the cursor */
		zIn += iChunk;
		if( zIn < zEnd ){
			/* Append the line break */
			jx9_result_string(pCtx, zBreak, iBreaklen);
		}
	}
	return JX9_OK;
}